

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

void FIO_LOG2STDERR(char *format,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  size_t __size;
  char *__ptr;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argv;
  undefined1 local_8b8 [8];
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined4 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  undefined8 local_818;
  char tmp___log [2048];
  
  argv[0].reg_save_area = local_8b8;
  if (in_AL != '\0') {
    local_888 = in_XMM0_Da;
    local_878 = in_XMM1_Qa;
    local_868 = in_XMM2_Qa;
    local_858 = in_XMM3_Qa;
    local_848 = in_XMM4_Qa;
    local_838 = in_XMM5_Qa;
    local_828 = in_XMM6_Qa;
    local_818 = in_XMM7_Qa;
  }
  argv[0].overflow_arg_area = &stack0x00000008;
  argv[0].gp_offset = 8;
  argv[0].fp_offset = 0x30;
  local_8b0 = in_RSI;
  local_8a8 = in_RDX;
  local_8a0 = in_RCX;
  local_898 = in_R8;
  local_890 = in_R9;
  uVar1 = vsnprintf(tmp___log,0x7fe,format,argv);
  if (uVar1 - 0x7fe < 0xfffff803) {
    if ((int)uVar1 < 0x7fe) {
      __ptr = "ERROR: log output error (can\'t write).\n";
      __size = 0x27;
      goto LAB_0010cacc;
    }
    builtin_strncpy(tmp___log + 0x7f0,"uncated).",9);
    builtin_strncpy(tmp___log + 0x7e0,"... (warning: tr",0x10);
    uVar1 = 0x7f9;
  }
  (tmp___log + uVar1)[0] = '\n';
  (tmp___log + uVar1)[1] = '0';
  __size = (ulong)uVar1 + 1;
  __ptr = tmp___log;
LAB_0010cacc:
  fwrite(__ptr,__size,1,_stderr);
  return;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}